

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# walletdb.cpp
# Opt level: O2

bool __thiscall wallet::WalletBatch::WritePool(WalletBatch *this,int64_t nPool,CKeyPool *keypool)

{
  bool bVar1;
  long in_FS_OFFSET;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>
  local_50;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  std::__cxx11::string::string
            ((string *)&local_50,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             DBKeys::POOL_abi_cxx11_);
  local_50.second = nPool;
  bVar1 = WriteIC<std::pair<std::__cxx11::string,long>,wallet::CKeyPool>
                    (this,&local_50,keypool,true);
  std::__cxx11::string::~string((string *)&local_50);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return bVar1;
  }
  __stack_chk_fail();
}

Assistant:

bool WalletBatch::WritePool(int64_t nPool, const CKeyPool& keypool)
{
    return WriteIC(std::make_pair(DBKeys::POOL, nPool), keypool);
}